

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::full_formatter::format
          (full_formatter *this,log_msg *msg,tm *tm_time,memory_buf_t *dest)

{
  memory_buf_t *dest_00;
  int iVar1;
  long lVar2;
  undefined *__src;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  uint uVar11;
  ptrdiff_t _Num_3;
  ulong uVar12;
  ptrdiff_t _Num_1;
  size_t sVar13;
  ptrdiff_t _Num;
  ulong uVar14;
  format_int local_50;
  
  lVar2 = (msg->time).__d.__r / 1000000000;
  sVar10 = (this->cached_datetime_).super_buffer<char>.size_;
  if (sVar10 == 0 || (this->cache_timestamp_).__r != lVar2) {
    dest_00 = &this->cached_datetime_;
    (this->cached_datetime_).super_buffer<char>.size_ = 0;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ == 0) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(dest_00,1);
      sVar5 = (this->cached_datetime_).super_buffer<char>.size_;
      sVar10 = sVar5 + 1;
    }
    else {
      sVar10 = 1;
      sVar5 = 0;
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar10;
    pcVar7[sVar5] = '[';
    iVar1 = tm_time->tm_year;
    uVar4 = iVar1 + 0x76c;
    uVar3 = -uVar4;
    if (0 < (int)uVar4) {
      uVar3 = uVar4;
    }
    pcVar6 = fmt::v6::format_int::format_decimal(&local_50,(ulong)uVar3);
    pcVar7 = pcVar6;
    if (iVar1 < -0x76c) {
      pcVar7 = pcVar6 + -1;
      pcVar6[-1] = '-';
    }
    sVar13 = (long)&local_50 + (0x15 - (long)pcVar7);
    sVar10 = sVar13 + (this->cached_datetime_).super_buffer<char>.size_;
    local_50.str_ = pcVar7;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < sVar10) {
      (**(dest_00->super_buffer<char>)._vptr_buffer)(dest_00,sVar10);
    }
    if (local_50.buffer_ + 0x15 != pcVar7) {
      memmove((this->cached_datetime_).super_buffer<char>.ptr_ +
              (this->cached_datetime_).super_buffer<char>.size_,pcVar7,sVar13);
    }
    (this->cached_datetime_).super_buffer<char>.size_ = sVar10;
    uVar14 = sVar10 + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar14) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(dest_00);
      sVar10 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar14 = sVar10 + 1;
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = uVar14;
    pcVar7[sVar10] = '-';
    fmt_helper::pad2(tm_time->tm_mon + 1,dest_00);
    sVar10 = (this->cached_datetime_).super_buffer<char>.size_;
    uVar14 = sVar10 + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar14) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(dest_00);
      sVar10 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar14 = sVar10 + 1;
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = uVar14;
    pcVar7[sVar10] = '-';
    fmt_helper::pad2(tm_time->tm_mday,dest_00);
    sVar10 = (this->cached_datetime_).super_buffer<char>.size_;
    uVar14 = sVar10 + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar14) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(dest_00);
      sVar10 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar14 = sVar10 + 1;
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = uVar14;
    pcVar7[sVar10] = ' ';
    fmt_helper::pad2(tm_time->tm_hour,dest_00);
    sVar10 = (this->cached_datetime_).super_buffer<char>.size_;
    uVar14 = sVar10 + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar14) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(dest_00);
      sVar10 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar14 = sVar10 + 1;
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = uVar14;
    pcVar7[sVar10] = ':';
    fmt_helper::pad2(tm_time->tm_min,dest_00);
    sVar10 = (this->cached_datetime_).super_buffer<char>.size_;
    uVar14 = sVar10 + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar14) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(dest_00);
      sVar10 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar14 = sVar10 + 1;
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = uVar14;
    pcVar7[sVar10] = ':';
    fmt_helper::pad2(tm_time->tm_sec,dest_00);
    sVar10 = (this->cached_datetime_).super_buffer<char>.size_;
    uVar14 = sVar10 + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar14) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(dest_00);
      sVar10 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar14 = sVar10 + 1;
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = uVar14;
    pcVar7[sVar10] = '.';
    (this->cache_timestamp_).__r = lVar2;
    sVar10 = (this->cached_datetime_).super_buffer<char>.size_;
  }
  pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
  uVar14 = (dest->super_buffer<char>).size_ + sVar10;
  if ((dest->super_buffer<char>).capacity_ < uVar14) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar14);
  }
  if (sVar10 != 0) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar10);
  }
  (dest->super_buffer<char>).size_ = uVar14;
  lVar2 = (msg->time).__d.__r;
  uVar12 = (lVar2 / 1000000000) * 0xfffffc18 + lVar2 / 1000000;
  uVar11 = (uint)uVar12;
  uVar3 = uVar11 | 1;
  uVar4 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar4 = (uVar4 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar4 = (uVar4 + 1) -
          (uint)(uVar11 < *(uint *)(fmt::v6::internal::basic_data<void>::zero_or_powers_of_10_32 +
                                   (ulong)uVar4 * 4));
  if (uVar4 < 3) {
    sVar13 = 3 - (ulong)uVar4;
    uVar14 = uVar14 + sVar13;
    if ((dest->super_buffer<char>).capacity_ < uVar14) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar14);
    }
    if ((ulong)uVar4 != 3) {
      memcpy((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,
             "0000000000000000000",sVar13);
    }
    (dest->super_buffer<char>).size_ = uVar14;
  }
  pcVar6 = fmt::v6::format_int::format_decimal(&local_50,uVar12 & 0xffffffff);
  pcVar7 = local_50.buffer_ + 0x15;
  sVar10 = (dest->super_buffer<char>).size_ + ((long)pcVar7 - (long)pcVar6);
  local_50.str_ = pcVar6;
  if ((dest->super_buffer<char>).capacity_ < sVar10) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,sVar10);
  }
  if (pcVar7 != pcVar6) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar6,
            (long)pcVar7 - (long)pcVar6);
  }
  (dest->super_buffer<char>).size_ = sVar10;
  uVar14 = sVar10 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar14) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar10 = (dest->super_buffer<char>).size_;
    uVar14 = sVar10 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar14;
  (dest->super_buffer<char>).ptr_[sVar10] = ']';
  sVar10 = (dest->super_buffer<char>).size_;
  uVar14 = sVar10 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar14) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar10 = (dest->super_buffer<char>).size_;
    uVar14 = sVar10 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar14;
  (dest->super_buffer<char>).ptr_[sVar10] = ' ';
  if ((msg->logger_name).size_ != 0) {
    sVar10 = (dest->super_buffer<char>).size_;
    uVar14 = sVar10 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar14) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar10 = (dest->super_buffer<char>).size_;
      uVar14 = sVar10 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar14;
    (dest->super_buffer<char>).ptr_[sVar10] = '[';
    pcVar6 = (msg->logger_name).data_;
    sVar10 = (dest->super_buffer<char>).size_;
    uVar14 = (dest->super_buffer<char>).capacity_;
    if (pcVar6 != (char *)0x0) {
      sVar13 = (msg->logger_name).size_;
      sVar10 = sVar10 + sVar13;
      if (uVar14 < sVar10) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest,sVar10);
      }
      if (sVar13 != 0) {
        memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar6,sVar13);
      }
      (dest->super_buffer<char>).size_ = sVar10;
      uVar14 = (dest->super_buffer<char>).capacity_;
    }
    uVar12 = sVar10 + 1;
    if (uVar14 < uVar12) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar10 = (dest->super_buffer<char>).size_;
      uVar12 = sVar10 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar12;
    (dest->super_buffer<char>).ptr_[sVar10] = ']';
    sVar10 = (dest->super_buffer<char>).size_;
    uVar14 = sVar10 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar14) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar10 = (dest->super_buffer<char>).size_;
      uVar14 = sVar10 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar14;
    (dest->super_buffer<char>).ptr_[sVar10] = ' ';
  }
  sVar10 = (dest->super_buffer<char>).size_;
  uVar14 = sVar10 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar14) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar10 = (dest->super_buffer<char>).size_;
    uVar14 = sVar10 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar14;
  (dest->super_buffer<char>).ptr_[sVar10] = '[';
  sVar10 = (dest->super_buffer<char>).size_;
  msg->color_range_start = sVar10;
  __src = (&level::level_string_views)[(ulong)msg->level * 2];
  uVar14 = (dest->super_buffer<char>).capacity_;
  if (__src != (undefined *)0x0) {
    sVar13 = *(size_t *)(&DAT_001ca708 + (ulong)msg->level * 0x10);
    sVar10 = sVar10 + sVar13;
    if (uVar14 < sVar10) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,sVar10);
    }
    if (sVar13 != 0) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,sVar13);
    }
    (dest->super_buffer<char>).size_ = sVar10;
    uVar14 = (dest->super_buffer<char>).capacity_;
  }
  msg->color_range_end = sVar10;
  uVar12 = sVar10 + 1;
  if (uVar14 < uVar12) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar10 = (dest->super_buffer<char>).size_;
    uVar12 = sVar10 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar12;
  (dest->super_buffer<char>).ptr_[sVar10] = ']';
  sVar10 = (dest->super_buffer<char>).size_;
  uVar14 = sVar10 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar14) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar10 = (dest->super_buffer<char>).size_;
    uVar14 = sVar10 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar14;
  (dest->super_buffer<char>).ptr_[sVar10] = ' ';
  if ((msg->source).line != 0) {
    sVar10 = (dest->super_buffer<char>).size_;
    uVar14 = sVar10 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar14) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar10 = (dest->super_buffer<char>).size_;
      uVar14 = sVar10 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar14;
    (dest->super_buffer<char>).ptr_[sVar10] = '[';
    pcVar6 = (msg->source).filename;
    pcVar8 = strrchr(pcVar6,0x2f);
    pcVar9 = pcVar8 + 1;
    if (pcVar8 == (char *)0x0) {
      pcVar9 = pcVar6;
    }
    sVar13 = strlen(pcVar9);
    sVar10 = (dest->super_buffer<char>).size_;
    uVar14 = (dest->super_buffer<char>).capacity_;
    if (pcVar9 != (char *)0x0) {
      sVar10 = sVar10 + sVar13;
      if (uVar14 < sVar10) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest,sVar10);
      }
      if (sVar13 != 0) {
        memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar9,sVar13);
      }
      (dest->super_buffer<char>).size_ = sVar10;
      uVar14 = (dest->super_buffer<char>).capacity_;
    }
    uVar12 = sVar10 + 1;
    if (uVar14 < uVar12) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar10 = (dest->super_buffer<char>).size_;
      uVar12 = sVar10 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar12;
    (dest->super_buffer<char>).ptr_[sVar10] = ':';
    uVar4 = (msg->source).line;
    uVar3 = -uVar4;
    if (0 < (int)uVar4) {
      uVar3 = uVar4;
    }
    pcVar9 = fmt::v6::format_int::format_decimal(&local_50,(ulong)uVar3);
    pcVar6 = pcVar9;
    if ((int)uVar4 < 0) {
      pcVar6 = pcVar9 + -1;
      pcVar9[-1] = '-';
    }
    sVar10 = (dest->super_buffer<char>).size_ + ((long)pcVar7 - (long)pcVar6);
    local_50.str_ = pcVar6;
    if ((dest->super_buffer<char>).capacity_ < sVar10) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,sVar10);
    }
    if (pcVar7 != pcVar6) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar6,
              (long)pcVar7 - (long)pcVar6);
    }
    (dest->super_buffer<char>).size_ = sVar10;
    uVar14 = sVar10 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar14) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar10 = (dest->super_buffer<char>).size_;
      uVar14 = sVar10 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar14;
    (dest->super_buffer<char>).ptr_[sVar10] = ']';
    sVar10 = (dest->super_buffer<char>).size_;
    uVar14 = sVar10 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar14) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar10 = (dest->super_buffer<char>).size_;
      uVar14 = sVar10 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar14;
    (dest->super_buffer<char>).ptr_[sVar10] = ' ';
  }
  pcVar7 = (msg->payload).data_;
  if (pcVar7 != (char *)0x0) {
    sVar13 = (msg->payload).size_;
    uVar14 = (dest->super_buffer<char>).size_ + sVar13;
    if ((dest->super_buffer<char>).capacity_ < uVar14) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar14);
    }
    if (sVar13 != 0) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar13);
    }
    (dest->super_buffer<char>).size_ = uVar14;
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        using std::chrono::duration_cast;
        using std::chrono::milliseconds;
        using std::chrono::seconds;

        // cache the date/time part for the next second.
        auto duration = msg.time.time_since_epoch();
        auto secs = duration_cast<seconds>(duration);

        if (cache_timestamp_ != secs || cached_datetime_.size() == 0)
        {
            cached_datetime_.clear();
            cached_datetime_.push_back('[');
            fmt_helper::append_int(tm_time.tm_year + 1900, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mon + 1, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mday, cached_datetime_);
            cached_datetime_.push_back(' ');

            fmt_helper::pad2(tm_time.tm_hour, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_min, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_sec, cached_datetime_);
            cached_datetime_.push_back('.');

            cache_timestamp_ = secs;
        }
        dest.append(cached_datetime_.begin(), cached_datetime_.end());

        auto millis = fmt_helper::time_fraction<milliseconds>(msg.time);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        dest.push_back(']');
        dest.push_back(' ');

#ifndef SPDLOG_NO_NAME
        if (msg.logger_name.size() > 0)
        {
            dest.push_back('[');
            // fmt_helper::append_str(*msg.logger_name, dest);
            fmt_helper::append_string_view(msg.logger_name, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
#endif
        dest.push_back('[');
        // wrap the level name with color
        msg.color_range_start = dest.size();
        // fmt_helper::append_string_view(level::to_c_str(msg.level), dest);
        fmt_helper::append_string_view(level::to_string_view(msg.level), dest);
        msg.color_range_end = dest.size();
        dest.push_back(']');
        dest.push_back(' ');

        // add source location if present
        if (!msg.source.empty())
        {
            dest.push_back('[');
            const char *filename = details::short_filename_formatter<details::null_scoped_padder>::basename(msg.source.filename);
            fmt_helper::append_string_view(filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
        // fmt_helper::append_string_view(msg.msg(), dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }